

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlconfig.c
# Opt level: O1

int configure_urlbase(IXML_Document *doc,sockaddr *serverAddr,char *alias,time_t last_modified,
                     char *docURL)

{
  char cVar1;
  ushort uVar2;
  time_t last_modified_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  char *__s;
  char *__s_00;
  long lVar12;
  ulong __maxlen;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  membuffer url_str;
  char buf_ntop [46];
  char ipaddr_port [180];
  membuffer local_210;
  time_t local_1f0;
  char *local_1e8;
  IXML_Document *local_1e0;
  membuffer local_1d8;
  uri_type local_1b8;
  char local_e8 [184];
  
  uVar2 = serverAddr->sa_family;
  uVar3 = (uint)uVar2;
  local_1e8 = docURL;
  if (uVar2 == 2) {
    pcVar13 = "%s:%d";
    lVar12 = 4;
LAB_0012029e:
    inet_ntop(uVar3,serverAddr->sa_data + lVar12 + -2,(char *)&local_1b8,0x2e);
    uVar3 = snprintf(local_e8,0xb4,pcVar13,&local_1b8,
                     (ulong)(ushort)(*(ushort *)serverAddr->sa_data << 8 |
                                    *(ushort *)serverAddr->sa_data >> 8));
    bVar15 = uVar3 < 0xb4;
  }
  else {
    bVar15 = true;
    if (uVar2 == 10) {
      pcVar13 = "[%s]:%d";
      uVar3 = 10;
      lVar12 = 8;
      goto LAB_0012029e;
    }
  }
  pcVar13 = (char *)0x0;
  iVar6 = -0x6a;
  if (bVar15) {
    local_1f0 = last_modified;
    membuffer_init(&local_210);
    membuffer_init(&local_1d8);
    lVar12 = ixmlDocument_getElementsByTagName(doc);
    local_1e0 = doc;
    if (lVar12 == 0) {
      lVar7 = ixmlDocument_createElement(doc);
      iVar6 = -0x68;
      iVar5 = iVar6;
      if (lVar7 != 0) {
        iVar5 = membuffer_append_str(&local_210,"http://");
        if ((((iVar5 == 0) && (iVar5 = membuffer_append_str(&local_210,local_e8), iVar5 == 0)) &&
            (iVar5 = membuffer_append_str(&local_210,"/"), iVar5 == 0)) &&
           (iVar5 = membuffer_append_str(&local_1d8,"/"), iVar5 == 0)) {
          lVar8 = ixmlNode_getFirstChild(doc);
          iVar6 = -0x6b;
          if (lVar8 != 0) {
            iVar5 = ixmlNode_appendChild(lVar8);
            pcVar13 = (char *)0x0;
            if (iVar5 == 0) {
              lVar8 = ixmlDocument_createTextNode(doc);
              if (lVar8 == 0) {
                bVar15 = true;
                iVar6 = 0;
                goto LAB_0012056c;
              }
              iVar6 = ixmlNode_appendChild(lVar7);
              if (iVar6 == 0) goto LAB_0012084e;
              iVar6 = -0x38f;
            }
          }
        }
        pcVar13 = (char *)0x0;
        bVar15 = false;
        goto LAB_0012056c;
      }
LAB_00120569:
      iVar6 = iVar5;
      pcVar13 = (char *)0x0;
      bVar15 = false;
      lVar7 = 0;
    }
    else {
      lVar7 = ixmlNodeList_item(lVar12);
      if (lVar7 == 0) {
        __assert_fail("urlbase_node != NULL",".upnp/src/urlconfig/urlconfig.c",0x11e,
                      "int config_description_doc(IXML_Document *, const char *, char **)");
      }
      lVar8 = ixmlNode_getFirstChild(lVar7);
      if (lVar8 == 0) {
        iVar5 = -0x6b;
        goto LAB_00120569;
      }
      pcVar13 = (char *)ixmlNode_getNodeValue(lVar8);
      iVar6 = -0x6c;
      iVar5 = -0x6c;
      if (pcVar13 == (char *)0x0) goto LAB_00120569;
      sVar9 = strlen(pcVar13);
      iVar4 = parse_uri(pcVar13,sVar9,&local_1b8);
      pcVar13 = (char *)0x0;
      bVar15 = false;
      if (iVar4 < 0) goto LAB_00120569;
      lVar7 = 0;
      if (local_1b8.type == ABSOLUTE) {
        iVar4 = membuffer_assign(&local_210,local_1b8.scheme.buff,local_1b8.scheme.size);
        iVar5 = -0x68;
        iVar6 = -0x68;
        if ((((((iVar4 != 0) || (iVar4 = membuffer_append_str(&local_210,"://"), iVar4 != 0)) ||
              (iVar4 = membuffer_append_str(&local_210,local_e8), iVar4 != 0)) ||
             (((local_1b8.pathquery.size == 0 || (*local_1b8.pathquery.buff != '/')) &&
              ((iVar4 = membuffer_append_str(&local_210,"/"), iVar4 != 0 ||
               (iVar4 = membuffer_append_str(&local_1d8,"/"), iVar4 != 0)))))) ||
            ((iVar4 = membuffer_append(&local_210,local_1b8.pathquery.buff,local_1b8.pathquery.size)
             , iVar4 != 0 ||
             (iVar4 = membuffer_append(&local_1d8,local_1b8.pathquery.buff,local_1b8.pathquery.size)
             , iVar4 != 0)))) ||
           ((local_210.buf[local_210.length - 1] != '/' &&
            (iVar4 = membuffer_append(&local_210,"/",1), iVar4 != 0)))) goto LAB_00120569;
        iVar5 = ixmlNode_setNodeValue(lVar8);
        lVar7 = 0;
        pcVar13 = (char *)0x0;
        bVar15 = false;
        if (iVar5 == 0) {
LAB_0012084e:
          pcVar13 = membuffer_detach(&local_1d8);
          iVar6 = 0;
          bVar15 = true;
        }
      }
    }
LAB_0012056c:
    if (bVar15) {
      ixmlNodeList_free(lVar12);
      membuffer_destroy(&local_1d8);
      membuffer_destroy(&local_210);
      if (pcVar13 == (char *)0x0) {
        __assert_fail("rootPath",".upnp/src/urlconfig/urlconfig.c",0x8a,
                      "int calc_alias(const char *, const char *, char **)");
      }
      if (alias == (char *)0x0) {
        __assert_fail("alias",".upnp/src/urlconfig/urlconfig.c",0x8b,
                      "int calc_alias(const char *, const char *, char **)");
      }
      sVar9 = strlen(pcVar13);
      if (sVar9 == 0) {
        pcVar14 = "/";
      }
      else {
        pcVar14 = "/";
        if (pcVar13[sVar9 - 1] == '/') {
          pcVar14 = "";
        }
      }
      cVar1 = *alias;
      sVar10 = strlen(pcVar14);
      sVar11 = strlen(alias + (cVar1 == '/'));
      sVar9 = sVar11 + sVar9 + sVar10 + 1;
      __s = (char *)malloc(sVar9);
      if (__s != (char *)0x0) {
        memset(__s,0,sVar9);
        snprintf(__s,sVar9,"%s%s%s",pcVar13,pcVar14,alias + (cVar1 == '/'));
        last_modified_00 = local_1f0;
        sVar9 = strlen(local_e8);
        if (sVar9 == 0) {
          __assert_fail("ipPortStr != NULL && strlen(ipPortStr) > 0",
                        ".upnp/src/urlconfig/urlconfig.c",0xc0,
                        "int calc_descURL(const char *, const char *, char *)");
        }
        if ((__s == (char *)0x0) || (sVar10 = strlen(__s), pcVar14 = local_1e8, sVar10 == 0)) {
          __assert_fail("alias != NULL && strlen(alias) > 0",".upnp/src/urlconfig/urlconfig.c",0xc1,
                        "int calc_descURL(const char *, const char *, char *)");
        }
        __maxlen = sVar9 + sVar10 + 8;
        iVar6 = -0x76;
        if (__maxlen < 0xb5) {
          iVar6 = 0;
          snprintf(local_1e8,__maxlen,"%s%s%s","http://",local_e8,__s);
          UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0xc9,"desc url: %s\n",pcVar14);
        }
        pcVar14 = (char *)0x0;
        if (__maxlen < 0xb5) {
          __s_00 = (char *)ixmlPrintDocument(local_1e0);
          if (__s_00 == (char *)0x0) {
            iVar6 = 0;
          }
          else {
            UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a0,"desc url: %s\n",
                       local_1e8);
            UpnpPrintf(UPNP_INFO,API,".upnp/src/urlconfig/urlconfig.c",0x1a1,"doc = %s\n",__s_00);
            sVar9 = strlen(__s_00);
            iVar6 = web_server_set_alias(__s,__s_00,sVar9,last_modified_00);
            pcVar14 = __s_00;
          }
        }
        goto LAB_001205f2;
      }
      iVar6 = -0x68;
    }
    else {
      ixmlElement_free(lVar7);
      ixmlNodeList_free(lVar12);
      membuffer_destroy(&local_1d8);
      membuffer_destroy(&local_210);
    }
  }
  __s = (char *)0x0;
  pcVar14 = (char *)0x0;
LAB_001205f2:
  free(pcVar13);
  free(__s);
  if (iVar6 != 0) {
    ixmlFreeDOMString(pcVar14);
  }
  return iVar6;
}

Assistant:

int configure_urlbase(IXML_Document *doc,
	const struct sockaddr *serverAddr,
	const char *alias,
	time_t last_modified,
	char docURL[LINE_SIZE])
{
	char *root_path = NULL;
	char *new_alias = NULL;
	char *xml_str = NULL;
	int err_code;
	char ipaddr_port[LINE_SIZE];

	/* get IP address and port */
	err_code = addrToString(serverAddr, ipaddr_port, sizeof(ipaddr_port));
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}

	/* config url-base in 'doc' */
	err_code = config_description_doc(doc, ipaddr_port, &root_path);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc alias */
	err_code = calc_alias(alias, root_path, &new_alias);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* calc full url for desc doc */
	err_code = calc_descURL(ipaddr_port, new_alias, docURL);
	if (err_code != UPNP_E_SUCCESS) {
		goto error_handler;
	}
	/* xml doc to str */
	xml_str = ixmlPrintDocument(doc);
	if (xml_str == NULL) {
		goto error_handler;
	}

	UpnpPrintf(
		UPNP_INFO, API, __FILE__, __LINE__, "desc url: %s\n", docURL);
	UpnpPrintf(UPNP_INFO, API, __FILE__, __LINE__, "doc = %s\n", xml_str);
	/* store in web server */
	err_code = web_server_set_alias(
		new_alias, xml_str, strlen(xml_str), last_modified);

error_handler:
	free(root_path);
	free(new_alias);

	if (err_code != UPNP_E_SUCCESS) {
		ixmlFreeDOMString(xml_str);
	}
	return err_code;
}